

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitSIMDLoad(PrintExpressionContents *this,SIMDLoad *curr)

{
  ulong uVar1;
  Index IVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  Module *in_R8;
  Name name;
  
  poVar5 = this->o;
  Colors::outputColorCode(poVar5,"\x1b[35m");
  Colors::outputColorCode(poVar5,"\x1b[1m");
  switch(curr->op) {
  case Load8SplatVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load8_splat";
    goto LAB_00844f23;
  case Load16SplatVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load16_splat";
    goto LAB_00844ef2;
  case Load32SplatVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load32_splat";
    goto LAB_00844ef2;
  case Load64SplatVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load64_splat";
LAB_00844ef2:
    lVar3 = 0x11;
    goto LAB_00844f3a;
  case Load8x8SVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load8x8_s";
    goto LAB_00844f04;
  case Load8x8UVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load8x8_u";
LAB_00844f04:
    lVar3 = 0xe;
    goto LAB_00844f3a;
  case Load16x4SVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load16x4_s";
    break;
  case Load16x4UVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load16x4_u";
    break;
  case Load32x2SVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load32x2_s";
    break;
  case Load32x2UVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load32x2_u";
    break;
  case Load32ZeroVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load32_zero";
    goto LAB_00844f23;
  case Load64ZeroVec128:
    poVar5 = this->o;
    pcVar4 = "v128.load64_zero";
LAB_00844f23:
    lVar3 = 0x10;
    goto LAB_00844f3a;
  default:
    goto switchD_00844e87_default;
  }
  lVar3 = 0xf;
LAB_00844f3a:
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,lVar3);
switchD_00844e87_default:
  Colors::outputColorCode(this->o,"\x1b[0m");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_217::printMemoryName
            ((anon_unknown_217 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar5 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," offset=",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  uVar1 = (curr->align).addr;
  IVar2 = SIMDLoad::getMemBytes(curr);
  if (uVar1 != IVar2) {
    poVar5 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," align=",7);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    return;
  }
  return;
}

Assistant:

void visitSIMDLoad(SIMDLoad* curr) {
    prepareColor(o);
    switch (curr->op) {
      case Load8SplatVec128:
        o << "v128.load8_splat";
        break;
      case Load16SplatVec128:
        o << "v128.load16_splat";
        break;
      case Load32SplatVec128:
        o << "v128.load32_splat";
        break;
      case Load64SplatVec128:
        o << "v128.load64_splat";
        break;
      case Load8x8SVec128:
        o << "v128.load8x8_s";
        break;
      case Load8x8UVec128:
        o << "v128.load8x8_u";
        break;
      case Load16x4SVec128:
        o << "v128.load16x4_s";
        break;
      case Load16x4UVec128:
        o << "v128.load16x4_u";
        break;
      case Load32x2SVec128:
        o << "v128.load32x2_s";
        break;
      case Load32x2UVec128:
        o << "v128.load32x2_u";
        break;
      case Load32ZeroVec128:
        o << "v128.load32_zero";
        break;
      case Load64ZeroVec128:
        o << "v128.load64_zero";
        break;
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
    if (curr->align != curr->getMemBytes()) {
      o << " align=" << curr->align;
    }
  }